

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O2

DdNode * Cudd_Inequality(DdManager *dd,int N,int c,DdNode **x,DdNode **y)

{
  int iVar1;
  int *piVar2;
  DdNode *pDVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  DdNode *pDVar9;
  DdNode *pDVar10;
  ulong uVar11;
  DdNode *n;
  int iVar12;
  int iVar13;
  int iVar14;
  DdNode *pDVar15;
  DdNode *n_00;
  int iVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int local_fc;
  DdNode *local_e8;
  DdNode *local_e0;
  DdNode *local_c0;
  
  pDVar3 = dd->one;
  pDVar15 = (DdNode *)((ulong)pDVar3 ^ 1);
  iVar21 = 1 << ((byte)N - 1 & 0x1f);
  if (N < 0) {
LAB_00621440:
    local_c0 = (DdNode *)0x0;
  }
  else if (N == 0) {
    local_c0 = pDVar3;
    if (c < 0) {
      local_c0 = pDVar15;
    }
  }
  else {
    iVar16 = 1 << ((byte)N & 0x1f);
    local_c0 = pDVar15;
    if ((c < iVar16) && (local_c0 = pDVar3, 1 - iVar16 < c)) {
      local_e0 = (DdNode *)0x0;
      local_e8 = (DdNode *)0x0;
      local_c0 = (DdNode *)0x0;
      uVar17 = 1;
      local_fc = c + -1;
      iVar19 = c;
      iVar16 = iVar21;
      iVar5 = iVar21;
      for (uVar11 = 1; uVar11 != N + 1; uVar11 = uVar11 + 1) {
        iVar7 = c + -1 >> ((byte)uVar11 & 0x1f);
        uVar4 = (uint)((uVar17 & c) != 1);
        iVar13 = c >> ((byte)uVar11 & 0x1f);
        uVar17 = uVar17 * 2 + 1;
        lVar8 = (uint)N - uVar11;
        iVar12 = 1 << ((byte)lVar8 & 0x1f);
        iVar1 = iVar13 + -1;
        iVar20 = iVar13 * 2;
        n = (DdNode *)0x0;
        n_00 = (DdNode *)0x0;
        iVar14 = iVar21;
        iVar18 = iVar21;
        for (; iVar13 <= (int)(iVar7 + uVar4); iVar13 = iVar13 + 1) {
          pDVar10 = n_00;
          iVar6 = iVar18;
          if ((iVar13 < iVar12) && (-iVar12 < iVar13)) {
            local_c0 = pDVar3;
            if ((iVar20 <= iVar19) && (local_c0 = pDVar15, local_fc < iVar20 + -1)) {
              if ((iVar16 + 1 != iVar20) && (iVar5 + 1 != iVar20)) {
                __assert_fail("leftChild == index[0] || leftChild == index[1]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddPriority.c"
                              ,0x331,
                              "DdNode *Cudd_Inequality(DdManager *, int, int, DdNode **, DdNode **)"
                             );
              }
              local_c0 = local_e0;
              if (iVar16 + 1 == iVar20) {
                local_c0 = local_e8;
              }
            }
            pDVar10 = pDVar3;
            if ((iVar20 < iVar19) && (pDVar10 = pDVar15, local_fc < iVar20)) {
              if ((iVar16 != iVar20) && (iVar5 != iVar20)) {
                __assert_fail("middleChild == index[0] || middleChild == index[1]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddPriority.c"
                              ,0x340,
                              "DdNode *Cudd_Inequality(DdManager *, int, int, DdNode **, DdNode **)"
                             );
              }
              pDVar10 = local_e0;
              if (iVar16 == iVar20) {
                pDVar10 = local_e8;
              }
            }
            pDVar9 = pDVar3;
            if ((iVar20 + 1 < iVar19) && (pDVar9 = pDVar15, local_fc <= iVar20)) {
              if ((iVar16 + -1 != iVar20) && (iVar5 + -1 != iVar20)) {
                __assert_fail("rightChild == index[0] || rightChild == index[1]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddPriority.c"
                              ,0x34f,
                              "DdNode *Cudd_Inequality(DdManager *, int, int, DdNode **, DdNode **)"
                             );
              }
              pDVar9 = local_e0;
              if (iVar16 + -1 == iVar20) {
                pDVar9 = local_e8;
              }
            }
            pDVar9 = Cudd_bddIte(dd,y[lVar8],pDVar10,pDVar9);
            if (pDVar9 != (DdNode *)0x0) {
              piVar2 = (int *)(((ulong)pDVar9 & 0xfffffffffffffffe) + 4);
              *piVar2 = *piVar2 + 1;
              pDVar10 = Cudd_bddIte(dd,y[lVar8],local_c0,pDVar10);
              if (pDVar10 != (DdNode *)0x0) {
                piVar2 = (int *)(((ulong)pDVar10 & 0xfffffffffffffffe) + 4);
                *piVar2 = *piVar2 + 1;
                local_c0 = Cudd_bddIte(dd,x[lVar8],pDVar9,pDVar10);
                if (local_c0 != (DdNode *)0x0) {
                  piVar2 = (int *)(((ulong)local_c0 & 0xfffffffffffffffe) + 4);
                  *piVar2 = *piVar2 + 1;
                  Cudd_IterDerefBdd(dd,pDVar9);
                  Cudd_IterDerefBdd(dd,pDVar10);
                  if (iVar14 != iVar21 && iVar18 != iVar21) {
                    __assert_fail("newIndex[0] == invalidIndex || newIndex[1] == invalidIndex",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddPriority.c"
                                  ,0x37a,
                                  "DdNode *Cudd_Inequality(DdManager *, int, int, DdNode **, DdNode **)"
                                 );
                  }
                  pDVar10 = local_c0;
                  iVar6 = iVar13;
                  if (iVar18 != iVar21) {
                    n = local_c0;
                    pDVar10 = n_00;
                    iVar14 = iVar13;
                    iVar6 = iVar18;
                  }
                  goto LAB_006212f3;
                }
                Cudd_IterDerefBdd(dd,pDVar9);
                pDVar9 = pDVar10;
              }
              Cudd_IterDerefBdd(dd,pDVar9);
            }
            if (iVar16 != iVar21) {
              Cudd_IterDerefBdd(dd,local_e8);
            }
            if (iVar5 != iVar21) {
              Cudd_IterDerefBdd(dd,local_e0);
            }
            if (iVar18 != iVar21) {
              Cudd_IterDerefBdd(dd,n_00);
            }
            if (iVar14 != iVar21) {
              Cudd_IterDerefBdd(dd,n);
            }
            goto LAB_00621440;
          }
LAB_006212f3:
          iVar18 = iVar6;
          iVar20 = iVar20 + 2;
          n_00 = pDVar10;
        }
        if (iVar16 != iVar21) {
          Cudd_IterDerefBdd(dd,local_e8);
        }
        if (iVar5 != iVar21) {
          Cudd_IterDerefBdd(dd,local_e0);
        }
        local_fc = iVar1;
        local_e8 = n_00;
        local_e0 = n;
        iVar19 = iVar7 + uVar4 + 1;
        iVar16 = iVar18;
        iVar5 = iVar14;
      }
      piVar2 = (int *)(((ulong)local_c0 & 0xfffffffffffffffe) + 4);
      *piVar2 = *piVar2 + -1;
    }
  }
  return local_c0;
}

Assistant:

DdNode *
Cudd_Inequality(
  DdManager * dd /* DD manager */,
  int  N /* number of x and y variables */,
  int c /* right-hand side constant */,
  DdNode ** x /* array of x variables */,
  DdNode ** y /* array of y variables */)
{
    /* The nodes at level i represent values of the difference that are
    ** multiples of 2^i.  We use variables with names starting with k
    ** to denote the multipliers of 2^i in such multiples. */
    int kTrue = c;
    int kFalse = c - 1;
    /* Mask used to compute the ceiling function.  Since we divide by 2^i,
    ** we want to know whether the dividend is a multiple of 2^i.  If it is,
    ** then ceiling and floor coincide; otherwise, they differ by one. */
    int mask = 1;
    int i;

    DdNode *f = NULL;           /* the eventual result */
    DdNode *one = DD_ONE(dd);
    DdNode *zero = Cudd_Not(one);

    /* Two x-labeled nodes are created at most at each iteration.  They are
    ** stored, along with their k values, in these variables.  At each level,
    ** the old nodes are freed and the new nodes are copied into the old map.
    */
    DdNode *map[2] = {0};
    int invalidIndex = 1 << (N-1);
    int index[2] = {invalidIndex, invalidIndex};

    /* This should never happen. */
    if (N < 0) return(NULL);

    /* If there are no bits, both operands are 0.  The result depends on c. */
    if (N == 0) {
        if (c >= 0) return(one);
        else return(zero);
    }

    /* The maximum or the minimum difference comparing to c can generate the terminal case */
    if ((1 << N) - 1 < c) return(zero);
    else if ((-(1 << N) + 1) >= c) return(one);

    /* Build the result bottom up. */
    for (i = 1; i <= N; i++) {
        int kTrueLower, kFalseLower;
        int leftChild, middleChild, rightChild;
        DdNode *g0, *g1, *fplus, *fequal, *fminus;
        int j;
        DdNode *newMap[2] = {NULL};
        int newIndex[2];

        kTrueLower = kTrue;
        kFalseLower = kFalse;
        /* kTrue = ceiling((c-1)/2^i) + 1 */
        kTrue = ((c-1) >> i) + ((c & mask) != 1) + 1;
        mask = (mask << 1) | 1;
        /* kFalse = floor(c/2^i) - 1 */
        kFalse = (c >> i) - 1;
        newIndex[0] = invalidIndex;
        newIndex[1] = invalidIndex;

        for (j = kFalse + 1; j < kTrue; j++) {
            /* Skip if node is not reachable from top of BDD. */
            if ((j >= (1 << (N - i))) || (j <= -(1 << (N -i)))) continue;

            /* Find f- */
            leftChild = (j << 1) - 1;
            if (leftChild >= kTrueLower) {
                fminus = one;
            } else if (leftChild <= kFalseLower) {
                fminus = zero;
            } else {
                assert(leftChild == index[0] || leftChild == index[1]);
                if (leftChild == index[0]) {
                    fminus = map[0];
                } else {
                    fminus = map[1];
                }
            }

            /* Find f= */
            middleChild = j << 1;
            if (middleChild >= kTrueLower) {
                fequal = one;
            } else if (middleChild <= kFalseLower) {
                fequal = zero;
            } else {
                assert(middleChild == index[0] || middleChild == index[1]);
                if (middleChild == index[0]) {
                    fequal = map[0];
                } else {
                    fequal = map[1];
                }
            }

            /* Find f+ */
            rightChild = (j << 1) + 1;
            if (rightChild >= kTrueLower) {
                fplus = one;
            } else if (rightChild <= kFalseLower) {
                fplus = zero;
            } else {
                assert(rightChild == index[0] || rightChild == index[1]);
                if (rightChild == index[0]) {
                    fplus = map[0];
                } else {
                    fplus = map[1];
                }
            }

            /* Build new nodes. */
            g1 = Cudd_bddIte(dd, y[N - i], fequal, fplus);
            if (g1 == NULL) {
                if (index[0] != invalidIndex) Cudd_IterDerefBdd(dd, map[0]);
                if (index[1] != invalidIndex) Cudd_IterDerefBdd(dd, map[1]);
                if (newIndex[0] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[0]);
                if (newIndex[1] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[1]);
                return(NULL);
            }
            cuddRef(g1);
            g0 = Cudd_bddIte(dd, y[N - i], fminus, fequal);
            if (g0 == NULL) {
                Cudd_IterDerefBdd(dd, g1);
                if (index[0] != invalidIndex) Cudd_IterDerefBdd(dd, map[0]);
                if (index[1] != invalidIndex) Cudd_IterDerefBdd(dd, map[1]);
                if (newIndex[0] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[0]);
                if (newIndex[1] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[1]);
                return(NULL);
            }
            cuddRef(g0);
            f = Cudd_bddIte(dd, x[N - i], g1, g0);
            if (f == NULL) {
                Cudd_IterDerefBdd(dd, g1);
                Cudd_IterDerefBdd(dd, g0);
                if (index[0] != invalidIndex) Cudd_IterDerefBdd(dd, map[0]);
                if (index[1] != invalidIndex) Cudd_IterDerefBdd(dd, map[1]);
                if (newIndex[0] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[0]);
                if (newIndex[1] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[1]);
                return(NULL);
            }
            cuddRef(f);
            Cudd_IterDerefBdd(dd, g1);
            Cudd_IterDerefBdd(dd, g0);

            /* Save newly computed node in map. */
            assert(newIndex[0] == invalidIndex || newIndex[1] == invalidIndex);
            if (newIndex[0] == invalidIndex) {
                newIndex[0] = j;
                newMap[0] = f;
            } else {
                newIndex[1] = j;
                newMap[1] = f;
            }
        }

        /* Copy new map to map. */
        if (index[0] != invalidIndex) Cudd_IterDerefBdd(dd, map[0]);
        if (index[1] != invalidIndex) Cudd_IterDerefBdd(dd, map[1]);
        map[0] = newMap[0];
        map[1] = newMap[1];
        index[0] = newIndex[0];
        index[1] = newIndex[1];
    }

    cuddDeref(f);
    return(f);

}